

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

HRESULT Memory::HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::
        GenerateValidPointersMapForBlockType(PAL_FILE *file)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ValidPointersMapRow *validTable;
  SmallHeapBlockBitVector *invalidTable;
  BlockInfoMapTable *blockInfoTable;
  uint j;
  ValidPointersMapRow *pauVar5;
  long lVar6;
  char16_t *pcVar7;
  uint i;
  long lVar8;
  SmallHeapBlockBitVector *pSVar9;
  uint i_1;
  uint uVar10;
  ushort *local_50;
  
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x133,"(file != nullptr)","file != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  validTable = (ValidPointersMapRow *)malloc(0x3a000);
  invalidTable = (SmallHeapBlockBitVector *)malloc(0x1d00);
  blockInfoTable = (BlockInfoMapTable *)malloc(0x3a0);
  uVar10 = 0x80004005;
  if (blockInfoTable != (BlockInfoMapTable *)0x0 &&
      (invalidTable != (SmallHeapBlockBitVector *)0x0 &&
      (ValidPointersMapTable *)validTable != (ValidPointersMapTable *)0x0)) {
    GenerateValidPointersMap
              ((ValidPointersMapTable *)validTable,(InvalidBitsTable *)invalidTable,blockInfoTable);
    iVar3 = PAL_fwprintf(file,L"#if USE_VPM_TABLE\n");
    if ((-1 < iVar3) &&
       (iVar3 = PAL_fwprintf(file,
                             L"const ushort HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::validPointersBuffer[MediumAllocationBlockAttributes::BucketCount][HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::rowSize] = \n{\n"
                            ), -1 < iVar3)) {
      lVar8 = 0;
      pauVar5 = validTable;
      while( true ) {
        if (lVar8 == 0x1d) {
          iVar3 = PAL_fwprintf(file,L"};\n");
          uVar10 = 0x80004005;
          if (((iVar3 < 0) || (iVar3 = PAL_fwprintf(file,L"#endif // USE_VPM_TABLE\n\n"), iVar3 < 0)
              ) || (iVar3 = PAL_fwprintf(file,
                                         L"const BVUnit HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData[MediumAllocationBlockAttributes::BucketCount][SmallHeapBlockT<MediumAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n"
                                        ), iVar3 < 0)) goto LAB_0065567b;
          lVar8 = 0;
          pSVar9 = invalidTable;
          goto LAB_00655702;
        }
        iVar3 = PAL_fwprintf(file,L"    {\n        ");
        if (iVar3 < 0) break;
        lVar6 = -0x1000;
        while (lVar6 != 0) {
          pcVar7 = L"0x%04hX, ";
          if (lVar6 + 1 == 0) {
            pcVar7 = L"0x%04hX";
          }
          iVar3 = PAL_fwprintf(file,pcVar7,(ulong)pauVar5[1][lVar6]);
          lVar6 = lVar6 + 1;
          if (iVar3 < 0) goto LAB_0065566d;
        }
        pcVar7 = L"\n    },\n";
        if (lVar8 == 0x1c) {
          pcVar7 = L"\n    }\n";
        }
        iVar3 = PAL_fwprintf(file,pcVar7);
        lVar8 = lVar8 + 1;
        pauVar5 = pauVar5 + 1;
        if (iVar3 < 0) break;
      }
LAB_0065566d:
      uVar10 = 0x80004005;
    }
  }
LAB_0065567b:
  free(validTable);
  free(invalidTable);
  return uVar10;
LAB_00655702:
  if (lVar8 == 0x1d) {
    iVar3 = PAL_fwprintf(file,
                         L"};\n// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\nconst HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsBuffers =\n    reinterpret_cast<const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData);\n"
                        );
    if ((-1 < iVar3) &&
       (iVar3 = PAL_fwprintf(file,
                             L"const SmallHeapBlockT<MediumAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::blockInfoBuffer[MediumAllocationBlockAttributes::BucketCount][MediumAllocationBlockAttributes::PageCount] = {\n"
                            ), -1 < iVar3)) {
      local_50 = &(*blockInfoTable)[0][0].pageObjectCount;
      lVar8 = 0;
      goto LAB_006557d1;
    }
    goto LAB_0065566d;
  }
  iVar3 = PAL_fwprintf(file,L"    {\n        ");
  if (iVar3 < 0) goto LAB_0065566d;
  lVar6 = -0x20;
  while (lVar6 != 0) {
    pcVar7 = L"0x%016I64X, ";
    if (lVar6 + 1 == 0) {
      pcVar7 = L"0x%016I64X";
    }
    iVar3 = PAL_fwprintf(file,pcVar7,pSVar9[1].data[lVar6].word);
    lVar6 = lVar6 + 1;
    if (iVar3 < 0) goto LAB_0065566d;
  }
  pcVar7 = L"\n    },\n";
  if (lVar8 == 0x1c) {
    pcVar7 = L"\n    }\n";
  }
  iVar3 = PAL_fwprintf(file,pcVar7);
  lVar8 = lVar8 + 1;
  pSVar9 = pSVar9 + 1;
  if (iVar3 < 0) goto LAB_0065566d;
  goto LAB_00655702;
LAB_006557d1:
  if (lVar8 == 0x1d) {
    iVar3 = PAL_fwprintf(file,L"};\n");
    uVar10 = iVar3 >> 0x1f & 0x80004005;
    goto LAB_0065567b;
  }
  iVar3 = PAL_fwprintf(file,L"    // Bucket: %u, Size: %d\n",lVar8,
                       (ulong)((int)(lVar8 + 1) * 0x100 + 0x300));
  if ((iVar3 < 0) || (iVar3 = PAL_fwprintf(file,L"    {\n"), iVar3 < 0)) goto LAB_0065566d;
  lVar6 = 0;
  while (lVar6 != 8) {
    iVar3 = PAL_fwprintf(file,L"        { ");
    if ((iVar3 < 0) ||
       (iVar3 = PAL_fwprintf(file,L"0x%04hX, 0x%04hX",(ulong)local_50[lVar6 * 2 + -1],
                             (ulong)local_50[lVar6 * 2]), iVar3 < 0)) goto LAB_0065566d;
    pcVar7 = L"\n    },\n";
    if (lVar6 == 7) {
      pcVar7 = L"\n    }\n";
    }
    iVar3 = PAL_fwprintf(file,pcVar7 + 4);
    lVar6 = lVar6 + 1;
    if (iVar3 < 0) goto LAB_0065566d;
  }
  pcVar7 = L"\n    },\n";
  if (lVar8 == 0x1c) {
    pcVar7 = L"\n    }\n";
  }
  iVar3 = PAL_fwprintf(file,pcVar7 + 1);
  local_50 = local_50 + 0x10;
  lVar8 = lVar8 + 1;
  if (iVar3 < 0) goto LAB_0065566d;
  goto LAB_006557d1;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(FILE* file)
{
#define IfErrorGotoCleanup(result) if ((result) < 0) { hr = E_FAIL; goto cleanup; }

    Assert(file != nullptr);
    HRESULT hr = S_OK;

    // Use heap to allocate the table so we don't bloat the stack (~64k). We only use this function
    // to generate headers as part of testing.
    ValidPointersMapTable *valid = (ValidPointersMapTable *)malloc(sizeof(ValidPointersMapTable));
    InvalidBitsTable *invalid = (InvalidBitsTable *)malloc(sizeof(InvalidBitsTable));
    BlockInfoMapTable *blockMap = (BlockInfoMapTable *)malloc(sizeof(BlockInfoMapTable));

    if (valid == nullptr || invalid == nullptr || blockMap == nullptr)
    {
        hr = E_FAIL;
        goto cleanup;
    }
    GenerateValidPointersMap(valid, *invalid, *blockMap);

    IfErrorGotoCleanup(fwprintf(file, _u("#if USE_VPM_TABLE\n")))
    IfErrorGotoCleanup(fwprintf(file, _u("const ushort HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::validPointersBuffer[MediumAllocationBlockAttributes::BucketCount][HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::rowSize] = \n{\n")));
    // Generate the full buffer.
    for (unsigned i = 0; i < HeapConstants::MediumBucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));
        for (unsigned j = 0; j < rowSize; ++j)
        {
            IfErrorGotoCleanup(fwprintf(
                file,
                (j < rowSize - 1) ? _u("0x%04hX, ") : _u("0x%04hX"),
                (*valid)[i][j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::MediumBucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));
    IfErrorGotoCleanup(fwprintf(file, _u("#endif // USE_VPM_TABLE\n\n")))

    // Generate the invalid bitvectors.
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const BVUnit HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData[MediumAllocationBlockAttributes::BucketCount][SmallHeapBlockT<MediumAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::MediumBucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));

        for (unsigned j = 0; j < (*invalid)[i].wordCount; ++j)
        {
            const char16 *format = (j < (*invalid)[i].wordCount - 1) ?
#if defined(TARGET_32)
                _u("0x%08X, ") : _u("0x%08X")
#elif defined(TARGET_64)
                _u("0x%016I64X, ") : _u("0x%016I64X")
#else
#error "Platform is not handled"
#endif
                ;
            IfErrorGotoCleanup(fwprintf(file, format, (*invalid)[i].GetRawData()[j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::MediumBucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("};\n")
        _u("// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\n")
        _u("const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsBuffers =\n")
        _u("    reinterpret_cast<const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData);\n")));

    // Generate the block map table
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const SmallHeapBlockT<MediumAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::blockInfoBuffer[MediumAllocationBlockAttributes::BucketCount][MediumAllocationBlockAttributes::PageCount] = {\n")));

    for (unsigned i = 0; i < HeapConstants::MediumBucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    // Bucket: %u, Size: %d\n"), i, (int)(HeapConstants::MaxSmallObjectSize + ((i + 1) * MediumAllocationBlockAttributes::BucketGranularity))));
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n")));

        for (unsigned j = 0; j < MediumAllocationBlockAttributes::PageCount; ++j)
        {
            IfErrorGotoCleanup(fwprintf(file, _u("        { ")));

            const char16 *format = _u("0x%04hX, 0x%04hX");
            IfErrorGotoCleanup(fwprintf(file, format, (*blockMap)[i][j].lastObjectIndexOnPage, (*blockMap)[i][j].pageObjectCount));
            IfErrorGotoCleanup(fwprintf(file, (j < MediumAllocationBlockAttributes::PageCount - 1 ? _u(" },\n") : _u(" }\n"))));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::MediumBucketCount - 1 ? _u("    },\n") : _u("    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));

cleanup:
#undef IfErrorGotoCleanup
    free(valid);
    free(invalid);
    return hr;
}